

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveAttachExpr(NameContext *pName,Expr *pExpr)

{
  int iVar1;
  Walker local_48;
  
  iVar1 = 0;
  if (pExpr != (Expr *)0x0) {
    if (pExpr->op == '\x1a') {
      pExpr->op = '^';
      iVar1 = 0;
    }
    else {
      iVar1 = sqlite3ResolveExprNames(pName,pExpr);
      if (iVar1 == 0) {
        local_48.pParse = (Parse *)0x0;
        local_48.walkerDepth = 0;
        local_48.bSelectDepthFirst = '\0';
        local_48._29_3_ = 0;
        local_48.u = (anon_union_8_4_3af73d92_for_u)0x1;
        local_48.xExprCallback = exprNodeIsConstant;
        local_48.xSelectCallback = selectNodeIsConstant;
        sqlite3WalkExpr(&local_48,pExpr);
        if (local_48.u.i != 0) {
          return 0;
        }
        sqlite3ErrorMsg(pName->pParse,"invalid name: \"%s\"",(pExpr->u).zToken);
      }
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int resolveAttachExpr(NameContext *pName, Expr *pExpr)
{
  int rc = SQLITE_OK;
  if( pExpr ){
    if( pExpr->op!=TK_ID ){
      rc = sqlite3ResolveExprNames(pName, pExpr);
      if( rc==SQLITE_OK && !sqlite3ExprIsConstant(pExpr) ){
        sqlite3ErrorMsg(pName->pParse, "invalid name: \"%s\"", pExpr->u.zToken);
        return SQLITE_ERROR;
      }
    }else{
      pExpr->op = TK_STRING;
    }
  }
  return rc;
}